

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

void __thiscall qclab::qgates::SWAP<float>::SWAP(SWAP<float> *this,int *qubits)

{
  int *qubits_local;
  SWAP<float> *this_local;
  
  QGate2<float>::QGate2(&this->super_QGate2<float>);
  (this->super_QGate2<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016cbb8;
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[6])(this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }